

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O1

LightLeSample * __thiscall
pbrt::SpotLight::SampleLe
          (LightLeSample *__return_storage_ptr__,SpotLight *this,Point2f *u1,Point2f *u2,
          SampledWavelengths *lambda,Float time)

{
  uintptr_t uVar1;
  float fVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  bool bVar6;
  byte bVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  bool bVar10;
  int iVar11;
  long lVar12;
  long in_FS_OFFSET;
  bool bVar13;
  bool bVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar45 [12];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  float fVar23;
  float fVar24;
  Float FVar25;
  Interval<float> i;
  Interval<float> i_00;
  Interval<float> i_01;
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar30 [56];
  undefined1 auVar29 [64];
  undefined1 auVar31 [16];
  undefined1 auVar32 [64];
  undefined1 auVar34 [56];
  undefined1 auVar33 [64];
  undefined1 auVar35 [16];
  float n2;
  float fVar36;
  float fVar37;
  float fVar38;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  float fVar41;
  undefined1 auVar42 [16];
  undefined1 auVar43 [64];
  SampledSpectrum SVar44;
  Float p [2];
  Point3fi o;
  Tuple3<pbrt::Vector3,_float> local_f8;
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  float local_b0 [2];
  undefined1 local_a8 [16];
  undefined1 local_98 [8];
  float fStack_90;
  float fStack_8c;
  Float local_7c;
  undefined1 local_78 [8];
  float fStack_70;
  float fStack_6c;
  Point3fi local_68;
  undefined1 local_48 [16];
  Interval<float> local_38;
  undefined1 extraout_var_01 [56];
  undefined1 extraout_var_02 [56];
  undefined1 extraout_var_03 [56];
  
  local_b0[0] = 1.0 - this->cosFalloffStart;
  local_b0[1] = (this->cosFalloffStart - this->cosFalloffEnd) * 0.5;
  local_f8.x = 0.0;
  local_f8.y = 0.0;
  local_f8.z = 0.0;
  fVar23 = (u2->super_Tuple2<pbrt::Point2,_float>).x;
  fVar38 = 0.0;
  lVar12 = 0;
  do {
    fVar38 = fVar38 + *(float *)((long)local_b0 + lVar12);
    lVar12 = lVar12 + 4;
  } while (lVar12 != 8);
  lVar12 = 0;
  do {
    if (fVar23 < local_b0[lVar12] / fVar38) goto LAB_003835dd;
    fVar23 = fVar23 - local_b0[lVar12] / fVar38;
    lVar12 = lVar12 + 1;
  } while (lVar12 != 2);
  lVar12 = 2;
LAB_003835dd:
  local_7c = time;
  local_e8._0_4_ = fVar38;
  if (SampleDiscrete(pstd::span<float_const>,float,float*,float*)::reg == '\0') {
    iVar11 = __cxa_guard_acquire(&SampleDiscrete(pstd::span<float_const>,float,float*,float*)::reg);
    if (iVar11 != 0) {
      StatRegisterer::StatRegisterer
                ((StatRegisterer *)&SampleDiscrete(pstd::span<float_const>,float,float*,float*)::reg
                 ,SampleDiscrete(pstd::span<float_const>,float,float*,float*)::
                  {lambda(pbrt::StatsAccumulator&)#1}::StatsAccumulator__,(PixelAccumFunc)0x0);
      __cxa_guard_release(&SampleDiscrete(pstd::span<float_const>,float,float*,float*)::reg);
    }
  }
  *(long *)(in_FS_OFFSET + -0x760) = *(long *)(in_FS_OFFSET + -0x760) + 1;
  if (lVar12 == 2) {
    *(long *)(in_FS_OFFSET + -0x768) = *(long *)(in_FS_OFFSET + -0x768) + 1;
    lVar12 = 1;
  }
  auVar15 = vdivss_avx512f(ZEXT416((uint)local_b0[(int)lVar12]),ZEXT416((uint)local_e8._0_4_));
  local_e8._0_4_ = auVar15._0_4_;
  if ((int)lVar12 == 0) {
    fVar23 = (u1->super_Tuple2<pbrt::Point2,_float>).x;
    auVar15 = vfmadd231ss_fma(ZEXT416((uint)(1.0 - fVar23)),ZEXT416((uint)fVar23),
                              ZEXT416((uint)this->cosFalloffStart));
    local_c8._0_4_ = auVar15._0_4_;
    auVar15 = vfnmadd213ss_fma(auVar15,auVar15,SUB6416(ZEXT464(0x3f800000),0));
    auVar16._0_12_ = ZEXT812(0);
    auVar16._12_4_ = 0;
    auVar15 = vmaxss_avx(auVar15,auVar16);
    if (auVar15._0_4_ < 0.0) {
      auVar32._0_4_ = sqrtf(auVar15._0_4_);
      auVar32._4_60_ = extraout_var_00;
      auVar15 = auVar32._0_16_;
    }
    else {
      auVar15 = vsqrtss_avx(auVar15,auVar15);
    }
    fVar23 = (u1->super_Tuple2<pbrt::Point2,_float>).y;
    local_98._0_4_ = (fVar23 + fVar23) * 3.1415927;
    auVar16 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar15);
    uVar3 = vcmpss_avx512f(auVar15,SUB6416(ZEXT464(0xbf800000),0),1);
    bVar13 = (bool)((byte)uVar3 & 1);
    local_a8._4_12_ = auVar16._4_12_;
    local_a8._0_4_ = (uint)bVar13 * -0x40800000 + (uint)!bVar13 * auVar16._0_4_;
    fVar23 = cosf((float)local_98._0_4_);
    local_d8 = ZEXT416((uint)(fVar23 * (float)local_a8._0_4_));
    fVar23 = sinf((float)local_98._0_4_);
    auVar15 = vinsertps_avx(local_d8,ZEXT416((uint)(fVar23 * (float)local_a8._0_4_)),0x10);
    auVar16 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),ZEXT416((uint)local_c8._0_4_));
    uVar3 = vcmpss_avx512f(ZEXT416((uint)local_c8._0_4_),SUB6416(ZEXT464(0xbf800000),0),1);
    bVar13 = (bool)((byte)uVar3 & 1);
    local_f8.z = (float)((uint)bVar13 * -0x40800000 + (uint)!bVar13 * auVar16._0_4_);
    local_f8._0_8_ = vmovlps_avx(auVar15);
    fVar23 = (1.0 / ((1.0 - this->cosFalloffStart) * 6.2831855)) * (float)local_e8._0_4_;
  }
  else {
    fVar23 = (u1->super_Tuple2<pbrt::Point2,_float>).x;
    fVar38 = this->cosFalloffStart;
    fVar24 = this->cosFalloffEnd;
    auVar32 = ZEXT464((uint)fVar24);
    auVar15 = ZEXT416((uint)fVar24);
    fVar2 = fVar38 - fVar24;
    fVar36 = (fVar24 - fVar24) / fVar2;
    fVar41 = fVar36 * fVar36;
    auVar16 = vfmsub231ss_avx512f(ZEXT416((uint)(fVar41 * fVar41)),ZEXT416(0x40000000),
                                  ZEXT416((uint)(fVar36 * fVar41)));
    fVar41 = auVar16._0_4_ - fVar23;
    auVar39._8_4_ = 0x7fffffff;
    auVar39._0_8_ = 0x7fffffff7fffffff;
    auVar39._12_4_ = 0x7fffffff;
    auVar16 = vandps_avx512vl(ZEXT416((uint)fVar41),auVar39);
    bVar13 = 1e-06 < auVar16._0_4_;
    if (1e-06 <= auVar16._0_4_) {
      fVar37 = fVar2 / fVar2;
      fVar36 = fVar37 * fVar37;
      auVar16 = vfmsub231ss_avx512f(ZEXT416((uint)(fVar36 * fVar36)),ZEXT416(0x40000000),
                                    ZEXT416((uint)(fVar37 * fVar36)));
      fVar36 = auVar16._0_4_ - fVar23;
      auVar18._8_4_ = 0x7fffffff;
      auVar18._0_8_ = 0x7fffffff7fffffff;
      auVar18._12_4_ = 0x7fffffff;
      auVar16 = vandps_avx512vl(ZEXT416((uint)fVar36),auVar18);
      fVar37 = auVar16._0_4_;
      bVar14 = fVar37 == 1e-06;
      bVar13 = 1e-06 < fVar37;
      if (1e-06 <= fVar37) {
        auVar43 = ZEXT464((uint)(fVar24 - (fVar2 * fVar41) / (fVar36 - fVar41)));
        auVar16 = vdivss_avx512f(ZEXT416(0x40000000),ZEXT416((uint)fVar2));
        auVar39 = ZEXT816(0) << 0x20;
        uVar3 = vcmpps_avx512vl(ZEXT416((uint)fVar41),auVar39,1);
        auVar40._8_4_ = 0x7fffffff;
        auVar40._0_8_ = 0x7fffffff7fffffff;
        auVar40._12_4_ = 0x7fffffff;
        auVar20 = ZEXT416((uint)fVar24);
        auVar19 = ZEXT416((uint)fVar38);
        do {
          fVar41 = auVar19._0_4_;
          auVar15 = vmulss_avx512f(ZEXT416((uint)(fVar41 + auVar20._0_4_)),
                                   SUB6416(ZEXT464(0x3f000000),0));
          uVar5 = vcmpss_avx512f(auVar43._0_16_,auVar19,1);
          bVar10 = (bool)((byte)uVar5 & 1);
          auVar17._4_12_ = auVar15._4_12_;
          uVar5 = vcmpss_avx512f(auVar20,auVar43._0_16_,1);
          bVar6 = (bool)((byte)uVar5 & 1);
          auVar17._0_4_ =
               (uint)bVar6 * ((uint)bVar10 * auVar43._0_4_ + (uint)!bVar10 * auVar15._0_4_) +
               (uint)!bVar6 * auVar15._0_4_;
          auVar15 = vsubss_avx512f(auVar17,auVar32._0_16_);
          auVar21._0_4_ = auVar15._0_4_ / fVar2;
          auVar21._4_12_ = auVar15._4_12_;
          auVar15 = vucomiss_avx512f(auVar17);
          auVar32 = ZEXT1664(auVar15);
          fVar24 = 0.0;
          if ((bVar13 || bVar14) &&
             (auVar17 = vucomiss_avx512f(ZEXT416((uint)fVar38)), bVar13 || bVar14)) {
            if ((auVar15._0_4_ != fVar38) || (NAN(auVar15._0_4_) || NAN(fVar38))) {
              auVar18 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar21);
              uVar5 = vcmpss_avx512f(auVar21,auVar39,1);
              auVar22._4_12_ = auVar18._4_12_;
              auVar22._0_4_ = (uint)!(bool)((byte)uVar5 & 1) * auVar18._0_4_;
              auVar18 = vmulss_avx512f(auVar22,auVar22);
              auVar19 = vfmadd213ss_avx512f(SUB6416(ZEXT464(0xc0000000),0),auVar22,
                                            SUB6416(ZEXT464(0x40400000),0));
              auVar18 = vmulss_avx512f(auVar18,auVar19);
              fVar24 = auVar18._0_4_;
            }
            else {
              uVar5 = vcmpss_avx512f(auVar17,auVar15,5);
              fVar24 = (float)((uint)((byte)uVar5 & 1) * 0x3f800000);
            }
            fVar24 = fVar24 * auVar16._0_4_;
          }
          auVar18 = vmulss_avx512f(auVar21,auVar21);
          auVar19 = vmulss_avx512f(auVar21,auVar18);
          auVar18 = vmulss_avx512f(auVar18,auVar18);
          auVar18 = vfmsub231ss_avx512f(auVar18,auVar19,ZEXT416(0x40000000));
          auVar18 = vsubss_avx512f(auVar18,ZEXT416((uint)fVar23));
          uVar5 = vcmpps_avx512vl(auVar18,auVar39,5);
          bVar7 = (byte)uVar3 ^ (byte)uVar5;
          iVar11 = auVar17._0_4_;
          register0x00000900 = auVar17._4_12_;
          auVar19._0_4_ = (uint)(bVar7 & 1) * (int)fVar41 + (uint)!(bool)(bVar7 & 1) * iVar11;
          auVar20._0_4_ = (uint)(bVar7 & 1) * iVar11 + (uint)!(bool)(bVar7 & 1) * (int)auVar20._0_4_
          ;
          auVar21 = vsubss_avx512f(auVar19,auVar20);
          auVar22 = vandps_avx512vl(auVar18,auVar40);
          uVar5 = vcmpps_avx512vl(auVar22,SUB6416(ZEXT464(0x358637bd),0),5);
          uVar4 = vcmpps_avx512vl(auVar21,SUB6416(ZEXT464(0x358637bd),0),5);
          bVar13 = false;
          bVar10 = (bool)((byte)uVar5 & (byte)uVar4 & 1);
          bVar14 = bVar10 == false;
          auVar42._0_4_ = auVar18._0_4_ / fVar24;
          auVar42._4_12_ = auVar18._4_12_;
          auVar18 = vsubss_avx512f(auVar17,auVar42);
          auVar18 = CONCAT124(register0x00000900,
                              (uint)bVar10 * auVar18._0_4_ + (uint)!bVar10 * iVar11);
          auVar43 = ZEXT1664(auVar18);
        } while (!bVar14);
      }
    }
    local_c8 = vucomiss_avx512f(auVar15);
    if ((bVar13) || (vucomiss_avx512f(local_c8), bVar13)) {
      LogFatal<char_const(&)[57]>
                (Fatal,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/lights.cpp"
                 ,0x4f8,"Check failed: %s",
                 (char (*) [57])"cosTheta >= cosFalloffEnd && cosTheta <= cosFalloffStart");
    }
    auVar15 = vfnmadd231ss_avx512f(SUB6416(ZEXT464(0x3f800000),0),local_c8,local_c8);
    auVar15 = vmaxss_avx(auVar15,ZEXT816(0) << 0x40);
    if (auVar15._0_4_ < 0.0) {
      auVar43._0_4_ = sqrtf(auVar15._0_4_);
      auVar43._4_60_ = extraout_var;
      auVar15 = auVar43._0_16_;
    }
    else {
      auVar15 = vsqrtss_avx(auVar15,auVar15);
    }
    fVar23 = (u1->super_Tuple2<pbrt::Point2,_float>).y;
    local_98._0_4_ = (fVar23 + fVar23) * 3.1415927;
    auVar16 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar15);
    uVar3 = vcmpss_avx512f(auVar15,SUB6416(ZEXT464(0xbf800000),0),1);
    bVar13 = (bool)((byte)uVar3 & 1);
    local_a8._4_12_ = auVar16._4_12_;
    local_a8._0_4_ = (uint)bVar13 * -0x40800000 + (uint)!bVar13 * auVar16._0_4_;
    fVar23 = cosf((float)local_98._0_4_);
    local_d8 = ZEXT416((uint)(fVar23 * (float)local_a8._0_4_));
    fVar23 = sinf((float)local_98._0_4_);
    auVar15 = vinsertps_avx(local_d8,ZEXT416((uint)(fVar23 * (float)local_a8._0_4_)),0x10);
    auVar16 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),local_c8);
    uVar3 = vcmpss_avx512f(local_c8,SUB6416(ZEXT464(0xbf800000),0),1);
    bVar13 = (bool)((byte)uVar3 & 1);
    local_f8.z = (float)((uint)bVar13 * -0x40800000 + (uint)!bVar13 * auVar16._0_4_);
    local_f8._0_8_ = vmovlps_avx(auVar15);
    fVar23 = this->cosFalloffEnd;
    fVar38 = local_c8._0_4_;
    if (fVar38 < fVar23) {
      fVar24 = 0.0;
    }
    else {
      fVar41 = this->cosFalloffStart;
      fVar24 = 0.0;
      if (fVar38 <= fVar41) {
        if ((fVar23 != fVar41) || (NAN(fVar23) || NAN(fVar41))) {
          auVar31._0_4_ = (fVar38 - fVar23) / (fVar41 - fVar23);
          auVar31._4_12_ = SUB6012((undefined1  [60])0x0,0);
          auVar15 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar31);
          uVar3 = vcmpss_avx512f(auVar31,ZEXT816(0),1);
          fVar38 = (float)((uint)!(bool)((byte)uVar3 & 1) * auVar15._0_4_);
          auVar15._0_4_ = fVar38;
          auVar15 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar15,ZEXT416(0x40400000));
          fVar24 = fVar38 * fVar38 * auVar15._0_4_;
        }
        else {
          uVar3 = vcmpss_avx512f(local_c8,ZEXT416((uint)fVar23),5);
          fVar24 = (float)((uint)((byte)uVar3 & 1) * 0x3f800000);
        }
        fVar24 = (2.0 / (fVar41 - fVar23)) * fVar24;
      }
    }
    fVar23 = ((float)local_e8._0_4_ * fVar24) / 6.2831855;
  }
  local_a8._0_4_ = fVar23;
  uVar1 = (this->super_LightBase).mediumInterface.outside.
          super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
          .bits;
  local_e8._0_4_ = local_f8.x;
  local_d8._0_4_ = local_f8.y;
  local_c8._0_4_ = local_f8.z;
  local_48._0_12_ = ZEXT812(0);
  local_48._12_4_ = 0;
  local_38.low = 0.0;
  local_38.high = 0.0;
  Transform::operator()(&local_68,&(this->super_LightBase).renderFromLight,(Point3fi *)local_48);
  auVar15 = vfmadd231ss_fma(ZEXT416((uint)((float)local_d8._0_4_ *
                                          (this->super_LightBase).renderFromLight.m.m[0][1])),
                            ZEXT416((uint)local_e8._0_4_),
                            ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[0][0]));
  auVar15 = vfmadd231ss_fma(auVar15,ZEXT416((uint)local_c8._0_4_),
                            ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[0][2]));
  auVar16 = vfmadd231ss_fma(ZEXT416((uint)((float)local_d8._0_4_ *
                                          (this->super_LightBase).renderFromLight.m.m[1][1])),
                            ZEXT416((uint)local_e8._0_4_),
                            ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[1][0]));
  auVar16 = vfmadd231ss_fma(auVar16,ZEXT416((uint)local_c8._0_4_),
                            ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[1][2]));
  auVar39 = vfmadd231ss_fma(ZEXT416((uint)((float)local_d8._0_4_ *
                                          (this->super_LightBase).renderFromLight.m.m[2][1])),
                            ZEXT416((uint)local_e8._0_4_),
                            ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[2][0]));
  local_e8 = vfmadd231ss_fma(auVar39,ZEXT416((uint)local_c8._0_4_),
                             ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[2][2]));
  fVar23 = auVar16._0_4_;
  auVar39 = vfmadd231ss_fma(ZEXT416((uint)(fVar23 * fVar23)),auVar15,auVar15);
  auVar39 = vfmadd231ss_fma(auVar39,local_e8,local_e8);
  local_d8 = auVar16;
  if (0.0 < auVar39._0_4_) {
    auVar35._8_4_ = 0x7fffffff;
    auVar35._0_8_ = 0x7fffffff7fffffff;
    auVar35._12_4_ = 0x7fffffff;
    auVar18 = vandps_avx(auVar15,auVar35);
    auVar16 = vandps_avx(auVar16,auVar35);
    auVar19 = vandps_avx(local_e8,auVar35);
    auVar16 = vfmadd231ss_fma(ZEXT416((uint)(auVar16._0_4_ * 0.0)),ZEXT816(0) << 0x20,auVar18);
    auVar16 = vfmadd231ss_fma(auVar16,ZEXT816(0) << 0x20,auVar19);
    fVar24 = auVar16._0_4_ / auVar39._0_4_;
    fVar38 = auVar15._0_4_ * fVar24;
    _local_78 = ZEXT416((uint)(fVar23 * fVar24));
    _local_98 = ZEXT416((uint)(local_e8._0_4_ * fVar24));
    i.high = fVar38;
    i.low = fVar38;
    local_c8 = auVar15;
    auVar26._0_8_ = Interval<float>::operator+<float>((Interval<float> *)&local_68,i);
    auVar26._8_56_ = extraout_var_01;
    uVar3 = vmovlps_avx(auVar26._0_16_);
    local_68.super_Point3<pbrt::Interval<float>_>.super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>
    .x.low = (float)uVar3;
    local_68.super_Point3<pbrt::Interval<float>_>.super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>
    .x.high = (float)((ulong)uVar3 >> 0x20);
    i_00.high = (float)local_78._0_4_;
    i_00.low = (float)local_78._0_4_;
    auVar27._0_8_ =
         Interval<float>::operator+<float>
                   (&local_68.super_Point3<pbrt::Interval<float>_>.
                     super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y,i_00);
    auVar27._8_56_ = extraout_var_02;
    uVar3 = vmovlps_avx(auVar27._0_16_);
    local_68.super_Point3<pbrt::Interval<float>_>.super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>
    .y.low = (float)uVar3;
    local_68.super_Point3<pbrt::Interval<float>_>.super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>
    .y.high = (float)((ulong)uVar3 >> 0x20);
    i_01.high = (float)local_98._0_4_;
    i_01.low = (float)local_98._0_4_;
    auVar28._0_8_ =
         Interval<float>::operator+<float>
                   (&local_68.super_Point3<pbrt::Interval<float>_>.
                     super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z,i_01);
    auVar28._8_56_ = extraout_var_03;
    local_68.super_Point3<pbrt::Interval<float>_>.super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>
    .z = (Interval<float>)vmovlps_avx(auVar28._0_16_);
    auVar15 = local_c8;
  }
  auVar9._4_4_ = local_68.super_Point3<pbrt::Interval<float>_>.
                 super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high;
  auVar9._0_4_ = local_68.super_Point3<pbrt::Interval<float>_>.
                 super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.low;
  auVar9._8_4_ = local_68.super_Point3<pbrt::Interval<float>_>.
                 super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.low;
  auVar9._12_4_ =
       local_68.super_Point3<pbrt::Interval<float>_>.
       super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.high;
  local_c8._0_4_ =
       (local_68.super_Point3<pbrt::Interval<float>_>.
        super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.low +
       local_68.super_Point3<pbrt::Interval<float>_>.
       super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.high) * 0.5;
  local_d8 = vinsertps_avx(auVar15,local_d8,0x10);
  auVar34 = ZEXT856(0);
  auVar15 = vinsertps_avx(auVar9,ZEXT416((uint)local_68.super_Point3<pbrt::Interval<float>_>.
                                               super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.
                                               high),0x10);
  local_98._4_4_ =
       local_68.super_Point3<pbrt::Interval<float>_>.
       super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.low + auVar15._4_4_;
  local_98._0_4_ =
       local_68.super_Point3<pbrt::Interval<float>_>.
       super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high + auVar15._0_4_;
  fStack_90 = auVar15._8_4_ + 0.0;
  fStack_8c = auVar15._12_4_ + 0.0;
  FVar25 = this->scale;
  local_78._4_4_ = FVar25;
  local_78._0_4_ = FVar25;
  fStack_70 = FVar25;
  fStack_6c = FVar25;
  auVar30 = ZEXT856(local_78._8_8_);
  SVar44 = DenselySampledSpectrum::Sample(&this->I,lambda);
  auVar33._0_8_ = SVar44.values.values._8_8_;
  auVar33._8_56_ = auVar34;
  auVar29._0_8_ = SVar44.values.values._0_8_;
  auVar29._8_56_ = auVar30;
  auVar15 = vmovlhps_avx(auVar29._0_16_,auVar33._0_16_);
  local_78._4_4_ = auVar15._4_4_ * (float)local_78._4_4_;
  local_78._0_4_ = auVar15._0_4_ * (float)local_78._0_4_;
  fStack_70 = auVar15._8_4_ * fStack_70;
  fStack_6c = auVar15._12_4_ * fStack_6c;
  FVar25 = Falloff(this,(Vector3f *)&local_f8);
  auVar8._8_4_ = 0x3f000000;
  auVar8._0_8_ = 0x3f0000003f000000;
  auVar8._12_4_ = 0x3f000000;
  auVar15 = vmulps_avx512vl(_local_98,auVar8);
  (__return_storage_ptr__->L).values.values[0] = FVar25 * (float)local_78._0_4_;
  (__return_storage_ptr__->L).values.values[1] = FVar25 * (float)local_78._4_4_;
  (__return_storage_ptr__->L).values.values[2] = FVar25 * fStack_70;
  (__return_storage_ptr__->L).values.values[3] = FVar25 * fStack_6c;
  uVar3 = vmovlps_avx(auVar15);
  (__return_storage_ptr__->ray).o.super_Tuple3<pbrt::Point3,_float>.x = (float)(int)uVar3;
  (__return_storage_ptr__->ray).o.super_Tuple3<pbrt::Point3,_float>.y =
       (float)(int)((ulong)uVar3 >> 0x20);
  (__return_storage_ptr__->ray).o.super_Tuple3<pbrt::Point3,_float>.z = (float)local_c8._0_4_;
  uVar3 = vmovlps_avx(local_d8);
  (__return_storage_ptr__->ray).d.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar3;
  (__return_storage_ptr__->ray).d.super_Tuple3<pbrt::Vector3,_float>.y =
       (float)(int)((ulong)uVar3 >> 0x20);
  (__return_storage_ptr__->ray).d.super_Tuple3<pbrt::Vector3,_float>.z = (float)local_e8._0_4_;
  (__return_storage_ptr__->ray).time = local_7c;
  (__return_storage_ptr__->ray).medium.
  super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
  .bits = uVar1;
  (__return_storage_ptr__->intr).set = false;
  __return_storage_ptr__->pdfPos = 1.0;
  __return_storage_ptr__->pdfDir = (Float)local_a8._0_4_;
  return __return_storage_ptr__;
}

Assistant:

LightLeSample SpotLight::SampleLe(const Point2f &u1, const Point2f &u2,
                                  SampledWavelengths &lambda, Float time) const {
    // Unnormalized probabilities of sampling each part.
    Float p[2] = {1 - cosFalloffStart, (cosFalloffStart - cosFalloffEnd) / 2};
    Float sectionPDF;
    Vector3f wl;
    int section = SampleDiscrete(p, u2[0], &sectionPDF);
    Float pdfDir;
    if (section == 0) {
        // Sample center cone
        wl = SampleUniformCone(u1, cosFalloffStart);
        pdfDir = sectionPDF * UniformConePDF(cosFalloffStart);
    } else {
        DCHECK_EQ(1, section);

        Float cosTheta = SampleSmoothStep(u1[0], cosFalloffEnd, cosFalloffStart);
        CHECK(cosTheta >= cosFalloffEnd && cosTheta <= cosFalloffStart);
        Float sinTheta = SafeSqrt(1 - cosTheta * cosTheta);
        Float phi = u1[1] * 2 * Pi;
        wl = SphericalDirection(sinTheta, cosTheta, phi);
        pdfDir = sectionPDF * SmoothStepPDF(cosTheta, cosFalloffEnd, cosFalloffStart) /
                 (2 * Pi);
    }

    Ray ray = renderFromLight(Ray(Point3f(0, 0, 0), wl, time, mediumInterface.outside));
    return LightLeSample(scale * I.Sample(lambda) * Falloff(wl), ray, 1, pdfDir);
}